

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cc
# Opt level: O0

shared_ptr<mcc::Token> __thiscall mcc::Scanner::GetToken(Scanner *this)

{
  ErrorReporter *pEVar1;
  bool bVar2;
  int iVar3;
  TokenType token_type;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_29;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_31;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_32;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_33;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_34;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_35;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_36;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_37;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_39;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_41;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_42;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_43;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_44;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_45;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_46;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_47;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_49;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  Scanner *in_RSI;
  shared_ptr<mcc::Token> sVar6;
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  undefined1 local_a0 [8];
  string identifier;
  undefined1 local_78 [4];
  int value;
  allocator<char> local_51;
  string local_50;
  undefined1 local_1a;
  char local_19;
  char c;
  Scanner *this_local;
  shared_ptr<mcc::Token> *token;
  
  this_local = this;
  local_19 = NextCharSkipSpaces(in_RSI);
  local_1a = 0;
  std::make_shared<mcc::Token>();
  peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  Token::SetLine(peVar4,in_RSI->line_);
  peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  Token::SetCount(peVar4,in_RSI->c_);
  switch(local_19) {
  default:
    iVar3 = isdigit((int)local_19);
    if (iVar3 == 0) {
      iVar3 = isalpha((int)local_19);
      if ((iVar3 == 0) && (local_19 != '_')) {
        pEVar1 = in_RSI->reporter_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"Unrecognizable token",&local_e1);
        ErrorReporter::Report(pEVar1,&local_e0,local_19,in_RSI->line_,in_RSI->c_);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator(&local_e1);
        _Var5._M_pi = extraout_RDX_50;
      }
      else {
        ScanIdent_abi_cxx11_((string *)local_a0,in_RSI,local_19);
        bVar2 = IsKeyword(in_RSI,(string *)local_a0);
        if (bVar2) {
          peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
          token_type = GetKeywordToken(in_RSI,(string *)local_a0);
          Token::SetType(peVar4,token_type);
        }
        else {
          peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
          Token::SetType(peVar4,T_IDENTIFIER);
          peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
          std::__cxx11::string::string((string *)&local_c0,(string *)local_a0);
          Token::SetString(peVar4,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
        }
        std::__cxx11::string::~string((string *)local_a0);
        _Var5._M_pi = extraout_RDX_49;
      }
    }
    else {
      identifier.field_2._12_4_ = ScanInt(in_RSI,local_19 + -0x30);
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetInt(peVar4,identifier.field_2._12_4_);
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_INT_LIT);
      _Var5._M_pi = extraout_RDX_48;
    }
    break;
  case '!':
    local_19 = Next(in_RSI);
    if (local_19 == '=') {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_NOT_EQUALS);
      _Var5._M_pi = extraout_RDX_43;
    }
    else {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_NOT);
      Putback(in_RSI,local_19);
      _Var5._M_pi = extraout_RDX_44;
    }
    break;
  case '\"':
    peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    ScanStr_abi_cxx11_((string *)local_78,in_RSI);
    Token::SetString(peVar4,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    Token::SetType(peVar4,T_STR_LIT);
    _Var5._M_pi = extraout_RDX_25;
    break;
  case '%':
    local_19 = Next(in_RSI);
    if (local_19 == '=') {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_ASSIGN_MOD);
      _Var5._M_pi = extraout_RDX_10;
    }
    else {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_MOD);
      Putback(in_RSI,local_19);
      _Var5._M_pi = extraout_RDX_11;
    }
    break;
  case '&':
    local_19 = Next(in_RSI);
    if (local_19 == '&') {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_AND);
      _Var5._M_pi = extraout_RDX_26;
    }
    else if (local_19 == '=') {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_ASSIGN_AND);
      _Var5._M_pi = extraout_RDX_27;
    }
    else {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_BIT_AND);
      Putback(in_RSI,local_19);
      _Var5._M_pi = extraout_RDX_28;
    }
    break;
  case '\'':
    peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    iVar3 = ScanChar(in_RSI);
    Token::SetInt(peVar4,iVar3);
    peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    Token::SetType(peVar4,T_INT_LIT);
    local_19 = Next(in_RSI);
    _Var5._M_pi = extraout_RDX_23;
    if (local_19 != '\'') {
      pEVar1 = in_RSI->reporter_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Char literal should end in quote",&local_51);
      ErrorReporter::Report(pEVar1,&local_50,local_19,in_RSI->line_,in_RSI->c_);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      Putback(in_RSI,local_19);
      _Var5._M_pi = extraout_RDX_24;
    }
    break;
  case '(':
    peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    Token::SetType(peVar4,T_LPAREN);
    _Var5._M_pi = extraout_RDX_19;
    break;
  case ')':
    peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    Token::SetType(peVar4,T_RPAREN);
    _Var5._M_pi = extraout_RDX_20;
    break;
  case '*':
    local_19 = Next(in_RSI);
    if (local_19 == '=') {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_ASSIGN_MUL);
      _Var5._M_pi = extraout_RDX_06;
    }
    else {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_STAR);
      Putback(in_RSI,local_19);
      _Var5._M_pi = extraout_RDX_07;
    }
    break;
  case '+':
    local_19 = Next(in_RSI);
    if (local_19 == '+') {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_INC);
      _Var5._M_pi = extraout_RDX;
    }
    else if (local_19 == '=') {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_ASSIGN_PLUS);
      _Var5._M_pi = extraout_RDX_00;
    }
    else {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_PLUS);
      Putback(in_RSI,local_19);
      _Var5._M_pi = extraout_RDX_01;
    }
    break;
  case ',':
    peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    Token::SetType(peVar4,T_COMMA);
    _Var5._M_pi = extraout_RDX_12;
    break;
  case '-':
    local_19 = Next(in_RSI);
    if (local_19 == '-') {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_DEC);
      _Var5._M_pi = extraout_RDX_02;
    }
    else if (local_19 == '>') {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_ARROW);
      _Var5._M_pi = extraout_RDX_03;
    }
    else if (local_19 == '=') {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_ASSIGN_MINUS);
      _Var5._M_pi = extraout_RDX_04;
    }
    else {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_MINUS);
      Putback(in_RSI,local_19);
      _Var5._M_pi = extraout_RDX_05;
    }
    break;
  case '.':
    peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    Token::SetType(peVar4,T_DOT);
    _Var5._M_pi = extraout_RDX_13;
    break;
  case '/':
    local_19 = Next(in_RSI);
    if (local_19 == '=') {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_ASSIGN_DIV);
      _Var5._M_pi = extraout_RDX_08;
    }
    else {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_SLASH);
      Putback(in_RSI,local_19);
      _Var5._M_pi = extraout_RDX_09;
    }
    break;
  case ':':
    peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    Token::SetType(peVar4,T_COLON);
    _Var5._M_pi = extraout_RDX_14;
    break;
  case ';':
    peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    Token::SetType(peVar4,T_SEMICOLON);
    _Var5._M_pi = extraout_RDX_18;
    break;
  case '<':
    local_19 = Next(in_RSI);
    if (local_19 == '=') {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_LESS_EQUAL);
      _Var5._M_pi = extraout_RDX_38;
    }
    else if (local_19 == '<') {
      local_19 = Next(in_RSI);
      if (local_19 == '=') {
        peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        Token::SetType(peVar4,T_ASSIGN_LSHIFT);
        _Var5._M_pi = extraout_RDX_39;
      }
      else {
        peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        Token::SetType(peVar4,T_LSHIFT);
        Putback(in_RSI,local_19);
        _Var5._M_pi = extraout_RDX_40;
      }
    }
    else {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_LESS);
      Putback(in_RSI,local_19);
      _Var5._M_pi = extraout_RDX_41;
    }
    break;
  case '=':
    local_19 = Next(in_RSI);
    if (local_19 == '=') {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_EQUALS);
      _Var5._M_pi = extraout_RDX_45;
    }
    else {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_ASSIGN);
      Putback(in_RSI,local_19);
      _Var5._M_pi = extraout_RDX_46;
    }
    break;
  case '>':
    local_19 = Next(in_RSI);
    if (local_19 == '=') {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_GREATER_EQUAL);
      _Var5._M_pi = extraout_RDX_34;
    }
    else if (local_19 == '>') {
      local_19 = Next(in_RSI);
      if (local_19 == '=') {
        peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        Token::SetType(peVar4,T_ASSIGN_RSHIFT);
        _Var5._M_pi = extraout_RDX_35;
      }
      else {
        peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        Token::SetType(peVar4,T_RSHIFT);
        Putback(in_RSI,local_19);
        _Var5._M_pi = extraout_RDX_36;
      }
    }
    else {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_GREATER);
      Putback(in_RSI,local_19);
      _Var5._M_pi = extraout_RDX_37;
    }
    break;
  case '?':
    peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    Token::SetType(peVar4,T_QUESTION);
    _Var5._M_pi = extraout_RDX_15;
    break;
  case '[':
    peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    Token::SetType(peVar4,T_LBRACKET);
    _Var5._M_pi = extraout_RDX_16;
    break;
  case ']':
    peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    Token::SetType(peVar4,T_RBRACKET);
    _Var5._M_pi = extraout_RDX_17;
    break;
  case '^':
    local_19 = Next(in_RSI);
    if (local_19 == '=') {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_ASSIGN_XOR);
      _Var5._M_pi = extraout_RDX_32;
    }
    else {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_BIT_XOR);
      Putback(in_RSI,local_19);
      _Var5._M_pi = extraout_RDX_33;
    }
    break;
  case '{':
    peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    Token::SetType(peVar4,T_LBRACE);
    _Var5._M_pi = extraout_RDX_21;
    break;
  case '|':
    local_19 = Next(in_RSI);
    if (local_19 == '|') {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_OR);
      _Var5._M_pi = extraout_RDX_29;
    }
    else if (local_19 == '=') {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_ASSIGN_OR);
      _Var5._M_pi = extraout_RDX_30;
    }
    else {
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Token::SetType(peVar4,T_BIT_OR);
      Putback(in_RSI,local_19);
      _Var5._M_pi = extraout_RDX_31;
    }
    break;
  case '}':
    peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    Token::SetType(peVar4,T_RBRACE);
    _Var5._M_pi = extraout_RDX_22;
    break;
  case '~':
    peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    Token::SetType(peVar4,T_NEG);
    _Var5._M_pi = extraout_RDX_42;
    break;
  case -0xffffff01:
    peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    Token::SetType(peVar4,T_EOF);
    _Var5._M_pi = extraout_RDX_47;
  }
  sVar6.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  sVar6.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<mcc::Token>)sVar6.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Token> Scanner::GetToken() {
  char c = NextCharSkipSpaces();
  std::shared_ptr<Token> token = std::make_shared<Token>();
  token->SetLine(line_);
  token->SetCount(c_);
  switch (c) {
    case '+':
      if ((c = Next()) == '+') {
        token->SetType(TokenType::T_INC);
      } else if (c == '=') {
        token->SetType(TokenType::T_ASSIGN_PLUS);
      } else {
        token->SetType(TokenType::T_PLUS);
        Putback(c);
      }
      break;
    case '-':
      if ((c = Next()) == '-') {
        token->SetType(TokenType::T_DEC);
      } else if (c == '>') {
        token->SetType(TokenType::T_ARROW);
      } else if (c == '=') {
        token->SetType(TokenType::T_ASSIGN_MINUS);
      } else {
        token->SetType(TokenType::T_MINUS);
        Putback(c);
      }
      break;
    case '*':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_ASSIGN_MUL);
      } else {
        token->SetType(TokenType::T_STAR);
        Putback(c);
      }
      break;
    case '/':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_ASSIGN_DIV);
      } else {
        token->SetType(TokenType::T_SLASH);
        Putback(c);
      }
      break;
    case '%':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_ASSIGN_MOD);
      } else {
        token->SetType(TokenType::T_MOD);
        Putback(c);
      }
      break;
    case ',':
      token->SetType(TokenType::T_COMMA);
      break;
    case '.':
      token->SetType(TokenType::T_DOT);
      break;
    case ':':
      token->SetType(TokenType::T_COLON);
      break;
    case '?':
      token->SetType(TokenType::T_QUESTION);
      break;
    case '[':
      token->SetType(TokenType::T_LBRACKET);
      break;
    case ']':
      token->SetType(TokenType::T_RBRACKET);
      break;
    case ';':
      token->SetType(TokenType::T_SEMICOLON);
      break;
    case '(':
      token->SetType(TokenType::T_LPAREN);
      break;
    case ')':
      token->SetType(TokenType::T_RPAREN);
      break;
    case '{':
      token->SetType(TokenType::T_LBRACE);
      break;
    case '}':
      token->SetType(TokenType::T_RBRACE);
      break;
    case '\'':
      token->SetInt(ScanChar());
      token->SetType(TokenType::T_INT_LIT);
      if ((c = Next()) != '\'') {
        reporter_.Report("Char literal should end in quote", c, line_, c_);
        Putback(c);
      }
      break;
    case '"':token->SetString(ScanStr());
      token->SetType(TokenType::T_STR_LIT);
      break;
    case '&':
      if ((c = Next()) == '&') {
        token->SetType(TokenType::T_AND);
      } else if (c == '=') {
        token->SetType(TokenType::T_ASSIGN_AND);
      } else {
        token->SetType(TokenType::T_BIT_AND);
        Putback(c);
      }
      break;
    case '|':
      if ((c = Next()) == '|') {
        token->SetType(TokenType::T_OR);
      } else if (c == '=') {
        token->SetType(TokenType::T_ASSIGN_OR);
      } else {
        token->SetType(TokenType::T_BIT_OR);
        Putback(c);
      }
      break;
    case '^':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_ASSIGN_XOR);
      } else {
        token->SetType(TokenType::T_BIT_XOR);
        Putback(c);
      }
      break;
    case '>':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_GREATER_EQUAL);
      } else if (c == '>') {
        if ((c = Next()) == '=') {
          token->SetType(TokenType::T_ASSIGN_RSHIFT);
        } else {
          token->SetType(TokenType::T_RSHIFT);
          Putback(c);
        }
      } else {
        token->SetType(TokenType::T_GREATER);
        Putback(c);
      }
      break;
    case '<':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_LESS_EQUAL);
      } else if (c == '<') {
        if ((c = Next()) == '=') {
          token->SetType(TokenType::T_ASSIGN_LSHIFT);
        } else {
          token->SetType(TokenType::T_LSHIFT);
          Putback(c);
        }
      } else {
        token->SetType(TokenType::T_LESS);
        Putback(c);
      }
      break;
    case '~':
      token->SetType(TokenType::T_NEG);
      break;
    case '!':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_NOT_EQUALS);
      } else {
        token->SetType(TokenType::T_NOT);
        Putback(c);
      }
      break;
    case '=':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_EQUALS);
      } else {
        token->SetType(TokenType::T_ASSIGN);
        Putback(c);
      }
      break;
    case EOF:
      token->SetType(TokenType::T_EOF);
      break;
    default:
      if (std::isdigit(c)) {
        int value = ScanInt(c - '0');
        token->SetInt(value);
        token->SetType(TokenType::T_INT_LIT);
      } else if (std::isalpha(c) || c == '_') {
        std::string identifier = ScanIdent(c);
        if (IsKeyword(identifier)) {
          token->SetType(GetKeywordToken(identifier));
        } else {
          token->SetType(TokenType::T_IDENTIFIER);
          token->SetString(identifier);
        }
      } else {
        reporter_.Report("Unrecognizable token", c, line_, c_);
      }
  }

  return token;
}